

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperOffset::Clear(ClipperOffset *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  long lVar3;
  
  ppPVar1 = (this->m_polyNodes).Childs.
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->m_polyNodes).Childs.
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppPVar2 - (long)ppPVar1) >> 3)) {
    lVar3 = 0;
    do {
      if (ppPVar1[lVar3] != (PolyNode *)0x0) {
        (*ppPVar1[lVar3]->_vptr_PolyNode[1])();
        ppPVar1 = (this->m_polyNodes).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar2 = (this->m_polyNodes).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)ppPVar2 - (long)ppPVar1) >> 3));
  }
  if (ppPVar2 != ppPVar1) {
    (this->m_polyNodes).Childs.
    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar1;
  }
  (this->m_lowest).X = -1;
  return;
}

Assistant:

void ClipperOffset::Clear()
{
  for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    delete m_polyNodes.Childs[i];
  m_polyNodes.Childs.clear();
  m_lowest.X = -1;
}